

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  std::__cxx11::string::append((string *)&this->stdOutForSuite);
  std::__cxx11::string::append((string *)&this->stdErrForSuite);
  CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,testCaseStats);
  return;
}

Assistant:

void JunitReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        stdOutForSuite += testCaseStats.stdOut;
        stdErrForSuite += testCaseStats.stdErr;
        CumulativeReporterBase::testCaseEnded( testCaseStats );
    }